

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * __thiscall flatbuffers::String::str_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  uint uVar1;
  char *pcVar2;
  allocator local_19;
  String *local_18;
  String *this_local;
  
  local_18 = this;
  this_local = (String *)__return_storage_ptr__;
  pcVar2 = c_str(this);
  uVar1 = Vector<char,_unsigned_int>::size(&this->super_Vector<char,_unsigned_int>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(ulong)uVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const { return std::string(c_str(), size()); }